

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::
dumpInstructions<std::set<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,spv::Builder::DecorationInstructionLessThan,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>>
          (Builder *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *out,
          set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
          *instructions)

{
  bool bVar1;
  reference this_00;
  pointer this_01;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst;
  iterator __end0;
  iterator __begin0;
  set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  *__range2;
  set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  *instructions_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *out_local;
  Builder *this_local;
  
  __end0 = std::
           set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
           ::begin(instructions);
  inst = (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
         std::
         set<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_spv::Builder::DecorationInstructionLessThan,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
         ::end(instructions);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&inst);
    if (!bVar1) break;
    this_00 = std::
              _Rb_tree_const_iterator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>
              ::operator*(&__end0);
    this_01 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                        (this_00);
    spv::Instruction::dump(this_01,out);
    std::
    _Rb_tree_const_iterator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void Builder::dumpInstructions(std::vector<unsigned int>& out, const Range& instructions) const
{
    for (const auto& inst : instructions) {
        inst->dump(out);
    }
}